

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t readback_bytes(mime_state *state,char *buffer,size_t bufsize,char *bytes,size_t numbytes,
                     char *trail,size_t traillen)

{
  size_t sVar1;
  ulong uVar2;
  size_t offset;
  size_t sz;
  char *trail_local;
  size_t numbytes_local;
  char *bytes_local;
  size_t bufsize_local;
  char *buffer_local;
  mime_state *state_local;
  
  sVar1 = curlx_sotouz(state->offset);
  if (sVar1 < numbytes) {
    offset = numbytes - sVar1;
    numbytes_local = (size_t)(bytes + sVar1);
  }
  else {
    uVar2 = sVar1 - numbytes;
    if (traillen <= uVar2) {
      return 0;
    }
    numbytes_local = (size_t)(trail + uVar2);
    offset = traillen - uVar2;
  }
  if (bufsize < offset) {
    offset = bufsize;
  }
  memcpy(buffer,(void *)numbytes_local,offset);
  state->offset = offset + state->offset;
  return offset;
}

Assistant:

static size_t readback_bytes(struct mime_state *state,
                             char *buffer, size_t bufsize,
                             const char *bytes, size_t numbytes,
                             const char *trail, size_t traillen)
{
  size_t sz;
  size_t offset = curlx_sotouz(state->offset);

  if(numbytes > offset) {
    sz = numbytes - offset;
    bytes += offset;
  }
  else {
    sz = offset - numbytes;
    if(sz >= traillen)
      return 0;
    bytes = trail + sz;
    sz = traillen - sz;
  }

  if(sz > bufsize)
    sz = bufsize;

  memcpy(buffer, bytes, sz);
  state->offset += sz;
  return sz;
}